

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterSetupMerge(VdbeSorter *pSorter)

{
  byte bVar1;
  sqlite3 *db_00;
  IncrMerger *pIncr_00;
  bool bVar2;
  SortSubtask *pSVar3;
  SorterCompare p_Var4;
  PmaReader *p;
  IncrMerger *pIncr;
  SortSubtask *pLast;
  PmaReader *pReadr;
  int iTask;
  SorterCompare xCompare;
  int i;
  sqlite3 *db;
  MergeEngine *pMain;
  SortSubtask *pTask0;
  VdbeSorter *pVStack_10;
  int rc;
  VdbeSorter *pSorter_local;
  
  pMain = (MergeEngine *)pSorter->aTask;
  db = (sqlite3 *)0x0;
  db_00 = (pSorter->aTask[0].pSorter)->db;
  pVStack_10 = pSorter;
  p_Var4 = vdbeSorterGetCompare(pSorter);
  for (xCompare._4_4_ = 0; xCompare._4_4_ < (int)(uint)pVStack_10->nTask;
      xCompare._4_4_ = xCompare._4_4_ + 1) {
    pVStack_10->aTask[xCompare._4_4_].xCompare = p_Var4;
  }
  pTask0._4_4_ = vdbeSorterMergeTreeBuild(pVStack_10,(MergeEngine **)&db);
  if (pTask0._4_4_ == 0) {
    if (pVStack_10->bUseThreads == '\0') {
      pTask0._4_4_ = vdbeMergeEngineInit((SortSubtask *)pMain,(MergeEngine *)db,0);
      pVStack_10->pMerger = (MergeEngine *)db;
      db = (sqlite3 *)0x0;
    }
    else {
      pLast = (SortSubtask *)0x0;
      bVar1 = pVStack_10->nTask;
      pSVar3 = pVStack_10->aTask;
      pTask0._4_4_ = vdbeSortAllocUnpacked(pSVar3 + (int)(bVar1 - 1));
      if (pTask0._4_4_ == 0) {
        pLast = (SortSubtask *)sqlite3DbMallocZero(db_00,0x50);
        pVStack_10->pReader = (PmaReader *)pLast;
        if (pLast == (SortSubtask *)0x0) {
          pTask0._4_4_ = 7;
        }
      }
      if (pTask0._4_4_ == 0) {
        pTask0._4_4_ = vdbeIncrMergerNew(pSVar3 + (int)(bVar1 - 1),(MergeEngine *)db,
                                         (IncrMerger **)&pLast->file);
        if (pTask0._4_4_ == 0) {
          vdbeIncrMergerSetThreads((IncrMerger *)(pLast->file).pFd);
          for (pReadr._4_4_ = 0; pReadr._4_4_ < (int)(pVStack_10->nTask - 1);
              pReadr._4_4_ = pReadr._4_4_ + 1) {
            pIncr_00 = (IncrMerger *)
                       db->mutex[(long)pReadr._4_4_ * 2 + 1].mutex.__data.__list.__next;
            if (pIncr_00 != (IncrMerger *)0x0) {
              vdbeIncrMergerSetThreads(pIncr_00);
            }
          }
          pReadr._4_4_ = 0;
          while( true ) {
            bVar2 = false;
            if (pTask0._4_4_ == 0) {
              bVar2 = pReadr._4_4_ < (int)(uint)pVStack_10->nTask;
            }
            if (!bVar2) break;
            pTask0._4_4_ = vdbePmaReaderIncrInit
                                     ((PmaReader *)(db->mutex + (long)pReadr._4_4_ * 2),1);
            pReadr._4_4_ = pReadr._4_4_ + 1;
          }
        }
        db = (sqlite3 *)0x0;
      }
      if (pTask0._4_4_ == 0) {
        pTask0._4_4_ = vdbePmaReaderIncrMergeInit((PmaReader *)pLast,2);
      }
    }
  }
  if (pTask0._4_4_ != 0) {
    vdbeMergeEngineFree((MergeEngine *)db);
  }
  return pTask0._4_4_;
}

Assistant:

static int vdbeSorterSetupMerge(VdbeSorter *pSorter){
  int rc;                         /* Return code */
  SortSubtask *pTask0 = &pSorter->aTask[0];
  MergeEngine *pMain = 0;
#if SQLITE_MAX_WORKER_THREADS
  sqlite3 *db = pTask0->pSorter->db;
  int i;
  SorterCompare xCompare = vdbeSorterGetCompare(pSorter);
  for(i=0; i<pSorter->nTask; i++){
    pSorter->aTask[i].xCompare = xCompare;
  }
#endif

  rc = vdbeSorterMergeTreeBuild(pSorter, &pMain);
  if( rc==SQLITE_OK ){
#if SQLITE_MAX_WORKER_THREADS
    assert( pSorter->bUseThreads==0 || pSorter->nTask>1 );
    if( pSorter->bUseThreads ){
      int iTask;
      PmaReader *pReadr = 0;
      SortSubtask *pLast = &pSorter->aTask[pSorter->nTask-1];
      rc = vdbeSortAllocUnpacked(pLast);
      if( rc==SQLITE_OK ){
        pReadr = (PmaReader*)sqlite3DbMallocZero(db, sizeof(PmaReader));
        pSorter->pReader = pReadr;
        if( pReadr==0 ) rc = SQLITE_NOMEM_BKPT;
      }
      if( rc==SQLITE_OK ){
        rc = vdbeIncrMergerNew(pLast, pMain, &pReadr->pIncr);
        if( rc==SQLITE_OK ){
          vdbeIncrMergerSetThreads(pReadr->pIncr);
          for(iTask=0; iTask<(pSorter->nTask-1); iTask++){
            IncrMerger *pIncr;
            if( (pIncr = pMain->aReadr[iTask].pIncr) ){
              vdbeIncrMergerSetThreads(pIncr);
              assert( pIncr->pTask!=pLast );
            }
          }
          for(iTask=0; rc==SQLITE_OK && iTask<pSorter->nTask; iTask++){
            /* Check that:
            **   
            **   a) The incremental merge object is configured to use the
            **      right task, and
            **   b) If it is using task (nTask-1), it is configured to run
            **      in single-threaded mode. This is important, as the
            **      root merge (INCRINIT_ROOT) will be using the same task
            **      object.
            */
            PmaReader *p = &pMain->aReadr[iTask];
            assert( p->pIncr==0 || (
                (p->pIncr->pTask==&pSorter->aTask[iTask])             /* a */
             && (iTask!=pSorter->nTask-1 || p->pIncr->bUseThread==0)  /* b */
            ));
            rc = vdbePmaReaderIncrInit(p, INCRINIT_TASK);
          }
        }
        pMain = 0;
      }
      if( rc==SQLITE_OK ){
        rc = vdbePmaReaderIncrMergeInit(pReadr, INCRINIT_ROOT);
      }
    }else
#endif
    {
      rc = vdbeMergeEngineInit(pTask0, pMain, INCRINIT_NORMAL);
      pSorter->pMerger = pMain;
      pMain = 0;
    }
  }

  if( rc!=SQLITE_OK ){
    vdbeMergeEngineFree(pMain);
  }
  return rc;
}